

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O3

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::StoreComponentOfValueToScalarVar
          (InterfaceVariableScalarReplacement *this,uint32_t value_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *component_indices,
          Instruction *scalar_var,uint32_t *extra_array_index,Instruction *insert_before)

{
  IRContext *this_00;
  TypeManager *this_01;
  uint32_t id;
  int iVar1;
  Type *pTVar2;
  undefined4 extraout_var;
  
  id = GetPointeeTypeIdOfVar(this,scalar_var);
  if (extra_array_index == (uint32_t *)0x0) {
    extra_array_index = (uint32_t *)0x0;
  }
  else {
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(this_00);
    }
    this_01 = (this_00->type_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
    pTVar2 = analysis::TypeManager::GetType(this_01,id);
    iVar1 = (*pTVar2->_vptr_Type[0x17])(pTVar2);
    if (CONCAT44(extraout_var,iVar1) == 0) {
      __assert_fail("array_type != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                    ,0x268,
                    "void spvtools::opt::InterfaceVariableScalarReplacement::StoreComponentOfValueToScalarVar(uint32_t, const std::vector<uint32_t> &, Instruction *, const uint32_t *, Instruction *)"
                   );
    }
    id = analysis::TypeManager::GetTypeInstruction
                   (this_01,*(Type **)(CONCAT44(extraout_var,iVar1) + 0x28));
    scalar_var = CreateAccessChainWithIndex(this,id,scalar_var,*extra_array_index,insert_before);
  }
  StoreComponentOfValueTo
            (this,id,value_id,component_indices,scalar_var,extra_array_index,insert_before);
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::StoreComponentOfValueToScalarVar(
    uint32_t value_id, const std::vector<uint32_t>& component_indices,
    Instruction* scalar_var, const uint32_t* extra_array_index,
    Instruction* insert_before) {
  uint32_t component_type_id = GetPointeeTypeIdOfVar(scalar_var);
  Instruction* ptr = scalar_var;
  if (extra_array_index) {
    auto* ty_mgr = context()->get_type_mgr();
    analysis::Array* array_type = ty_mgr->GetType(component_type_id)->AsArray();
    assert(array_type != nullptr);
    component_type_id = ty_mgr->GetTypeInstruction(array_type->element_type());
    ptr = CreateAccessChainWithIndex(component_type_id, scalar_var,
                                     *extra_array_index, insert_before);
  }

  StoreComponentOfValueTo(component_type_id, value_id, component_indices, ptr,
                          extra_array_index, insert_before);
}